

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64_t google::protobuf::internal::ThreadSafeArena::GetNextLifeCycleId(void)

{
  uint64_t uVar1;
  long in_FS_OFFSET;
  
  uVar1 = *(uint64_t *)(in_FS_OFFSET + -0x80);
  if ((char)uVar1 == '\0') {
    LOCK();
    UNLOCK();
    uVar1 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  *(uint64_t *)(in_FS_OFFSET + -0x80) = uVar1 + 1;
  return uVar1;
}

Assistant:

uint64_t ThreadSafeArena::GetNextLifeCycleId() {
  ThreadCache& tc = thread_cache();
  uint64_t id = tc.next_lifecycle_id;
  constexpr uint64_t kInc = ThreadCache::kPerThreadIds;
  if (ABSL_PREDICT_FALSE((id & (kInc - 1)) == 0)) {
    // On platforms that don't support uint64_t atomics we can certainly not
    // afford to increment by large intervals and expect uniqueness due to
    // wrapping, hence we only add by 1.
    id = lifecycle_id_.fetch_add(1, std::memory_order_relaxed) * kInc;
  }
  tc.next_lifecycle_id = id + 1;
  return id;
}